

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  int iVar1;
  int iVar2;
  char *__src;
  int *piVar3;
  sockaddr local_8e [6];
  undefined1 local_21;
  
  if ((handle->io_watcher).fd < 0) {
    __src = strdup(name);
    iVar2 = -1;
    if (__src == (char *)0x0) {
      iVar1 = -0xc;
    }
    else {
      iVar1 = uv__socket(1,1,0);
      if (-1 < iVar1) {
        strncpy(local_8e[0].sa_data,__src,0x6b);
        local_21 = 0;
        local_8e[0].sa_family = 1;
        iVar2 = bind(iVar1,local_8e,0x6e);
        if (iVar2 == 0) {
          handle->pipe_fname = __src;
          (handle->io_watcher).fd = iVar1;
          return 0;
        }
        piVar3 = __errno_location();
        iVar2 = iVar1;
        iVar1 = -0xd;
        if (*piVar3 != 2) {
          iVar1 = -*piVar3;
        }
      }
    }
    uv__close(iVar2);
    free(__src);
  }
  else {
    iVar1 = -0x16;
  }
  return iVar1;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname;
  int sockfd;
  int bound;
  int err;

  pipe_fname = NULL;
  sockfd = -1;
  bound = 0;
  err = -EINVAL;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return -EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = strdup(name);
  if (pipe_fname == NULL) {
    err = -ENOMEM;
    goto out;
  }

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto out;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = -errno;
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == -ENOENT)
      err = -EACCES;
    goto out;
  }
  bound = 1;

  /* Success. */
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

out:
  if (bound) {
    /* unlink() before uv__close() to avoid races. */
    assert(pipe_fname != NULL);
    unlink(pipe_fname);
  }
  uv__close(sockfd);
  free((void*)pipe_fname);
  return err;
}